

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

crn_thread_id_t crnlib::crn_get_current_thread_id(void)

{
  pthread_t pVar1;
  
  pVar1 = pthread_self();
  return pVar1;
}

Assistant:

crn_thread_id_t crn_get_current_thread_id()
    {
#if defined(CRN_OS_BSD4) || defined(CRN_OS_DARWIN)
        crn_thread_id_t id;
        pthread_threadid_np(pthread_self(), &id);
        return id;
#else
        return static_cast<crn_thread_id_t>(pthread_self());
#endif
    }